

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O3

void nhdp_interface_update_status(nhdp_interface *interf)

{
  char cVar1;
  list_entity *plVar2;
  bool bVar3;
  list_entity *plVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  plVar4 = (interf->_links).next;
  plVar2 = (interf->_links).prev;
  if (plVar4->prev == plVar2) {
    iVar9 = 0;
    iVar7 = 0;
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    iVar7 = 0;
    iVar9 = 0;
    do {
      if (*(int *)((long)&plVar4[-0xc].prev + 4) == 1) {
        cVar1 = *(char *)&plVar4[-10].next[1].next;
        if (plVar4[-0xb].prev == (list_entity *)0x0) {
          if (cVar1 == '\x02') {
            iVar8 = iVar8 + 1;
          }
          else {
            iVar7 = iVar7 + (uint)(cVar1 == '\n');
          }
        }
        else {
          iVar9 = iVar9 + (uint)(cVar1 == '\x02');
        }
      }
      plVar4 = plVar4->next;
    } while (plVar4->prev != plVar2);
  }
  if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
    oonf_log(1,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0xb3,0,0,
             "Interface %s: ipv4_only=%d ipv6_only=%d dualstack=%d",(interf->_node).key,iVar8,iVar7,
             iVar9);
  }
  iVar5 = (uint)(iVar8 == 0) * 8 + 2;
  iVar6 = 0;
  if (iVar7 == 0) {
    iVar6 = iVar5;
  }
  interf->use_ipv4_for_flooding = iVar8 != 0;
  if (iVar8 == 0) {
    iVar6 = iVar5;
  }
  if (iVar9 == 0) {
    iVar6 = 0;
  }
  bVar3 = iVar8 == 0 && iVar9 != 0 || iVar7 != 0;
  interf->use_ipv6_for_flooding = bVar3;
  interf->dualstack_af_type = iVar6;
  if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
    oonf_log(1,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0xc6,0,0,
             "Interface %s: floodv4=%d floodv6=%d dualstack=%d",(interf->_node).key,iVar8 != 0,bVar3
             ,iVar6);
  }
  return;
}

Assistant:

void
nhdp_interface_update_status(struct nhdp_interface *interf) {
  struct nhdp_link *lnk;
  uint32_t ipv4_only, ipv6_only, dualstack;

  ipv4_only = 0;
  ipv6_only = 0;
  dualstack = 0;

  list_for_each_element(&interf->_links, lnk, _if_node) {
    if (lnk->status != NHDP_LINK_SYMMETRIC) {
      /* link is not symmetric */
      continue;
    }

    if (lnk->dualstack_partner != NULL) {
      if (netaddr_get_address_family(&lnk->neigh->originator) == AF_INET) {
        /* count dualstack only once, not for IPv4 and IPv6 */
        dualstack++;
      }
      continue;
    }

    /* we have a non-dualstack node */
    if (netaddr_get_address_family(&lnk->neigh->originator) == AF_INET) {
      ipv4_only++;
    }
    else if (netaddr_get_address_family(&lnk->neigh->originator) == AF_INET6) {
      ipv6_only++;
    }
  }

  OONF_DEBUG(LOG_NHDP, "Interface %s: ipv4_only=%d ipv6_only=%d dualstack=%d", nhdp_interface_get_name(interf),
    ipv4_only, ipv6_only, dualstack);

  interf->use_ipv4_for_flooding = ipv4_only > 0;
  interf->use_ipv6_for_flooding = ipv6_only > 0 || (ipv4_only == 0 && dualstack > 0);

  interf->dualstack_af_type = AF_UNSPEC;
  if (dualstack > 0) {
    /* we have dualstack capable nodes */
    if (ipv4_only == 0) {
      /* use IPv6 for dualstack, we have no ipv4-only neighbors */
      interf->dualstack_af_type = AF_INET6;
    }
    else if (ipv6_only == 0) {
      /* use IPv4 for dualstack, we have no ipv6-only neighbors */
      interf->dualstack_af_type = AF_INET;
    }
  }

  OONF_DEBUG(LOG_NHDP, "Interface %s: floodv4=%d floodv6=%d dualstack=%d", nhdp_interface_get_name(interf),
    interf->use_ipv4_for_flooding, interf->use_ipv6_for_flooding, interf->dualstack_af_type);
}